

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O1

int __thiscall RenX::Server::sendAdminMessage(Server *this,string_view message)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type sVar3;
  size_type *psVar4;
  int iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  rep rVar7;
  char *in_RCX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  ulong uVar9;
  undefined8 uVar10;
  string_view str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  size_type *local_68;
  size_type local_60;
  size_type local_58;
  undefined8 uStack_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  str._M_len = message._M_str;
  paVar1 = &local_48.field_2;
  local_48.field_2._M_allocated_capacity._0_4_ = 0x736d6163;
  local_48.field_2._M_allocated_capacity._4_2_ = 0x2067;
  local_48._M_string_length = 6;
  local_48.field_2._M_local_buf[6] = '\0';
  str._M_str = in_RCX;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  escapifyRCON_abi_cxx11_(&local_88,(RenX *)message._M_len,str);
  uVar9 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    uVar9 = CONCAT17(local_48.field_2._M_local_buf[7],
                     CONCAT16(local_48.field_2._M_local_buf[6],
                              CONCAT24(local_48.field_2._M_allocated_capacity._4_2_,
                                       local_48.field_2._M_allocated_capacity._0_4_)));
  }
  if (uVar9 < local_88._M_string_length + local_48._M_string_length) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      uVar10 = local_88.field_2._M_allocated_capacity;
    }
    if (local_88._M_string_length + local_48._M_string_length <= (ulong)uVar10) {
      pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_88,0,0,local_48._M_dataplus._M_p,local_48._M_string_length);
      goto LAB_0013280a;
    }
  }
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_48,local_88._M_dataplus._M_p,local_88._M_string_length);
LAB_0013280a:
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar6->_M_dataplus)._M_p;
  paVar8 = &pbVar6->field_2;
  if (paVar2 == paVar8) {
    local_a8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_a8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
  }
  else {
    local_a8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_a8._M_dataplus._M_p = (pointer)paVar2;
  }
  local_a8._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar6->_M_string_length = 0;
  paVar8->_M_local_buf[0] = '\0';
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_replace_aux(&local_a8,local_a8._M_string_length,0,1,'\n');
  local_68 = (size_type *)(pbVar6->_M_dataplus)._M_p;
  paVar8 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68 == paVar8) {
    local_58 = paVar8->_M_allocated_capacity;
    uStack_50 = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_68 = &local_58;
  }
  else {
    local_58 = paVar8->_M_allocated_capacity;
  }
  psVar4 = local_68;
  sVar3 = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  local_60 = sVar3;
  rVar7 = std::chrono::_V2::steady_clock::now();
  (this->m_lastSendActivity).__d.__r = rVar7;
  iVar5 = Jupiter::Socket::send(&this->m_sock,sVar3,psVar4);
  if (local_68 != &local_58) {
    operator_delete(local_68,local_58 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT17(local_48.field_2._M_local_buf[7],
                             CONCAT16(local_48.field_2._M_local_buf[6],
                                      CONCAT24(local_48.field_2._M_allocated_capacity._4_2_,
                                               local_48.field_2._M_allocated_capacity._0_4_))) + 1);
  }
  return iVar5;
}

Assistant:

int RenX::Server::sendAdminMessage(std::string_view message) {
	return sendSocket("camsg "s + RenX::escapifyRCON(message) + '\n');
}